

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParseExceptNameClass(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node,int attr)

{
  int iVar1;
  _xmlDoc *def;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  xmlNodePtr local_48;
  xmlNodePtr child;
  xmlRelaxNGDefinePtr_conflict last;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict ret;
  int attr_local;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  child = (xmlNodePtr)0x0;
  if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) || (node->type != XML_ELEMENT_NODE)
      ) || ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"except"), iVar1 == 0 ||
            (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 == 0)))) {
    xmlRngPErr(ctxt,node,0x404,"Expecting an except node\n",(xmlChar *)0x0,(xmlChar *)0x0);
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    if (node->next != (_xmlNode *)0x0) {
      xmlRngPErr(ctxt,node,0x405,"exceptNameClass allows only a single except node\n",(xmlChar *)0x0
                 ,(xmlChar *)0x0);
    }
    if (node->children == (_xmlNode *)0x0) {
      xmlRngPErr(ctxt,node,0x403,"except has no content\n",(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlRelaxNGParserCtxtPtr)xmlRelaxNGNewDefine(ctxt,node);
      if (ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0) {
        ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
      }
      else {
        *(xmlRelaxNGType *)&ctxt_local->userData = XML_RELAXNG_EXCEPT;
        local_48 = node->children;
        while ((local_48 != (xmlNodePtr)0x0 &&
               (def = (_xmlDoc *)xmlRelaxNGNewDefine(ctxt,local_48), def != (_xmlDoc *)0x0))) {
          if (attr == 0) {
            *(xmlRelaxNGType *)&def->_private = XML_RELAXNG_ELEMENT;
          }
          else {
            *(xmlRelaxNGType *)&def->_private = XML_RELAXNG_ATTRIBUTE;
          }
          pxVar2 = xmlRelaxNGParseNameClass(ctxt,local_48,(xmlRelaxNGDefinePtr_conflict)def);
          if (pxVar2 != (xmlRelaxNGDefinePtr_conflict)0x0) {
            if (child == (xmlNodePtr)0x0) {
              ctxt_local->grammar = (xmlRelaxNGGrammarPtr_conflict)def;
              child = (xmlNodePtr)def;
            }
            else {
              child->doc = def;
              child = (xmlNodePtr)def;
            }
          }
          local_48 = local_48->next;
        }
      }
    }
  }
  return (xmlRelaxNGDefinePtr_conflict)ctxt_local;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseExceptNameClass(xmlRelaxNGParserCtxtPtr ctxt,
                               xmlNodePtr node, int attr)
{
    xmlRelaxNGDefinePtr ret, cur, last = NULL;
    xmlNodePtr child;

    if (!IS_RELAXNG(node, "except")) {
        xmlRngPErr(ctxt, node, XML_RNGP_EXCEPT_MISSING,
                   "Expecting an except node\n", NULL, NULL);
        return (NULL);
    }
    if (node->next != NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_EXCEPT_MULTIPLE,
                   "exceptNameClass allows only a single except node\n",
                   NULL, NULL);
    }
    if (node->children == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_EXCEPT_EMPTY, "except has no content\n",
                   NULL, NULL);
        return (NULL);
    }

    ret = xmlRelaxNGNewDefine(ctxt, node);
    if (ret == NULL)
        return (NULL);
    ret->type = XML_RELAXNG_EXCEPT;
    child = node->children;
    while (child != NULL) {
        cur = xmlRelaxNGNewDefine(ctxt, child);
        if (cur == NULL)
            break;
        if (attr)
            cur->type = XML_RELAXNG_ATTRIBUTE;
        else
            cur->type = XML_RELAXNG_ELEMENT;

        if (xmlRelaxNGParseNameClass(ctxt, child, cur) != NULL) {
            if (last == NULL) {
                ret->content = cur;
            } else {
                last->next = cur;
            }
            last = cur;
        }
        child = child->next;
    }

    return (ret);
}